

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void Catch::loadTestNamesFromFile(ConfigData *config,string *_filename)

{
  string *__return_storage_ptr__;
  char cVar1;
  bool bVar2;
  istream *piVar3;
  long *plVar4;
  domain_error *this;
  long *plVar5;
  long local_2a0;
  ifstream f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_78;
  undefined1 local_70 [8];
  string line;
  long local_40;
  long lStack_38;
  
  std::ifstream::ifstream((istream *)&local_2a0,(_filename->_M_dataplus)._M_p,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    local_70 = (undefined1  [8])&line._M_string_length;
    line._M_dataplus._M_p = (pointer)0x0;
    line._M_string_length._0_1_ = 0;
    local_78 = &config->testsOrTags;
    __return_storage_ptr__ = (string *)(&line.field_2._M_allocated_capacity + 1);
    while( true ) {
      cVar1 = std::ios::widen((char)*(undefined8 *)(local_2a0 + -0x18) + (char)(istream *)&local_2a0
                             );
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&local_2a0,(string *)local_70,cVar1);
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
      trim(__return_storage_ptr__,(string *)local_70);
      std::__cxx11::string::operator=((string *)local_70,(string *)__return_storage_ptr__);
      if ((long *)line.field_2._8_8_ != &stack0xffffffffffffffc0) {
        operator_delete((void *)line.field_2._8_8_,local_40 + 1);
      }
      if (line._M_dataplus._M_p != (pointer)0x0) {
        line.field_2._8_8_ = &stack0xffffffffffffffc0;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"#","");
        bVar2 = startsWith((string *)local_70,__return_storage_ptr__);
        if ((long *)line.field_2._8_8_ != &stack0xffffffffffffffc0) {
          operator_delete((void *)line.field_2._8_8_,local_40 + 1);
        }
        if (!bVar2) {
          std::operator+(&local_98,"\"",(string *)local_70);
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_98);
          plVar5 = plVar4 + 2;
          if ((long *)*plVar4 == plVar5) {
            local_40 = *plVar5;
            lStack_38 = plVar4[3];
            line.field_2._8_8_ = &stack0xffffffffffffffc0;
          }
          else {
            local_40 = *plVar5;
            line.field_2._8_8_ = (long *)*plVar4;
          }
          *plVar4 = (long)plVar5;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(local_78,__return_storage_ptr__);
          if ((long *)line.field_2._8_8_ != &stack0xffffffffffffffc0) {
            operator_delete((void *)line.field_2._8_8_,local_40 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
        }
      }
    }
    if (local_70 != (undefined1  [8])&line._M_string_length) {
      operator_delete((void *)local_70,
                      CONCAT71(line._M_string_length._1_7_,(undefined1)line._M_string_length) + 1);
    }
    std::ifstream::~ifstream(&local_2a0);
    return;
  }
  this = (domain_error *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                 "Unable to load input file: ",_filename);
  std::domain_error::domain_error(this,(string *)local_70);
  __cxa_throw(this,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

inline void loadTestNamesFromFile( ConfigData& config, std::string const& _filename ) {
        std::ifstream f( _filename.c_str() );
        if( !f.is_open() )
            throw std::domain_error( "Unable to load input file: " + _filename );

        std::string line;
        while( std::getline( f, line ) ) {
            line = trim(line);
            if( !line.empty() && !startsWith( line, "#" ) )
                addTestOrTags( config, "\"" + line + "\"," );
        }
    }